

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_declared_capabilities
          (spvc_compiler compiler,SpvCapability **capabilities,size_t *num_capabilities)

{
  pointer this;
  SmallVector<spv::Capability,_8UL> *this_00;
  SpvCapability *pSVar1;
  size_t sVar2;
  SmallVector<spv::Capability,_8UL> *caps;
  size_t *num_capabilities_local;
  SpvCapability **capabilities_local;
  spvc_compiler compiler_local;
  
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  this_00 = spirv_cross::Compiler::get_declared_capabilities(this);
  pSVar1 = spirv_cross::VectorView<spv::Capability>::data
                     (&this_00->super_VectorView<spv::Capability>);
  *capabilities = pSVar1;
  sVar2 = spirv_cross::VectorView<spv::Capability>::size
                    (&this_00->super_VectorView<spv::Capability>);
  *num_capabilities = sVar2;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_capabilities(spvc_compiler compiler, const SpvCapability **capabilities,
                                                    size_t *num_capabilities)
{
	auto &caps = compiler->compiler->get_declared_capabilities();
	static_assert(sizeof(SpvCapability) == sizeof(spv::Capability), "Enum size mismatch.");
	*capabilities = reinterpret_cast<const SpvCapability *>(caps.data());
	*num_capabilities = caps.size();
	return SPVC_SUCCESS;
}